

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Program.cpp
# Opt level: O0

int llvm::sys::ExecuteAndWait
              (StringRef Program,ArrayRef<llvm::StringRef> Args,
              Optional<llvm::ArrayRef<llvm::StringRef>_> Env,
              ArrayRef<llvm::Optional<llvm::StringRef>_> Redirects,uint SecondsToWait,
              uint MemoryLimit,string *ErrMsg,bool *ExecutionFailed)

{
  ArrayRef<llvm::Optional<llvm::StringRef>_> Redirects_00;
  bool bVar1;
  size_t sVar2;
  ProcessInfo PVar3;
  bool local_c1;
  int local_b8;
  ProcessInfo Result;
  undefined1 local_54 [8];
  ProcessInfo PI;
  ArrayRef<llvm::Optional<llvm::StringRef>_> Redirects_local;
  ArrayRef<llvm::StringRef> Args_local;
  StringRef Program_local;
  
  PI._4_8_ = Redirects.Data;
  bVar1 = ArrayRef<llvm::Optional<llvm::StringRef>_>::empty
                    ((ArrayRef<llvm::Optional<llvm::StringRef>_> *)&PI.Process);
  local_c1 = true;
  if (!bVar1) {
    sVar2 = ArrayRef<llvm::Optional<llvm::StringRef>_>::size
                      ((ArrayRef<llvm::Optional<llvm::StringRef>_> *)&PI.Process);
    local_c1 = sVar2 == 3;
  }
  if (!local_c1) {
    __assert_fail("Redirects.empty() || Redirects.size() == 3",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/Program.cpp"
                  ,0x24,
                  "int llvm::sys::ExecuteAndWait(StringRef, ArrayRef<StringRef>, Optional<ArrayRef<StringRef>>, ArrayRef<Optional<StringRef>>, unsigned int, unsigned int, std::string *, bool *)"
                 );
  }
  ProcessInfo::ProcessInfo((ProcessInfo *)local_54);
  Redirects_00.Length = Redirects.Length;
  Redirects_00.Data = (Optional<llvm::StringRef> *)PI._4_8_;
  bVar1 = Execute((ProcessInfo *)local_54,Program,Args,Env,Redirects_00,MemoryLimit,ErrMsg);
  if (bVar1) {
    if (ExecutionFailed != (bool *)0x0) {
      *ExecutionFailed = false;
    }
    PVar3 = Wait((ProcessInfo *)local_54,SecondsToWait,SecondsToWait == 0,ErrMsg);
    local_b8 = PVar3.ReturnCode;
    Program_local.Length._4_4_ = local_b8;
  }
  else {
    if (ExecutionFailed != (bool *)0x0) {
      *ExecutionFailed = true;
    }
    Program_local.Length._4_4_ = -1;
  }
  return Program_local.Length._4_4_;
}

Assistant:

int sys::ExecuteAndWait(StringRef Program, ArrayRef<StringRef> Args,
                        Optional<ArrayRef<StringRef>> Env,
                        ArrayRef<Optional<StringRef>> Redirects,
                        unsigned SecondsToWait, unsigned MemoryLimit,
                        std::string *ErrMsg, bool *ExecutionFailed) {
  assert(Redirects.empty() || Redirects.size() == 3);
  ProcessInfo PI;
  if (Execute(PI, Program, Args, Env, Redirects, MemoryLimit, ErrMsg)) {
    if (ExecutionFailed)
      *ExecutionFailed = false;
    ProcessInfo Result = Wait(
        PI, SecondsToWait, /*WaitUntilTerminates=*/SecondsToWait == 0, ErrMsg);
    return Result.ReturnCode;
  }

  if (ExecutionFailed)
    *ExecutionFailed = true;

  return -1;
}